

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O2

void __thiscall FatSystem::enableWrite(FatSystem *this)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  ostringstream oss;
  
  close(this->fd);
  iVar1 = open((this->filename)._M_dataplus._M_p,2);
  this->fd = iVar1;
  if (-1 < iVar1) {
    this->writeMode = true;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"! Unable to open the input file: ");
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::operator<<(poVar2," for writing");
  uVar3 = __cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  __cxa_throw(uVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void FatSystem::enableWrite()
{
    close(fd);
    fd = open(filename.c_str(), O_RDWR|O_LARGEFILE);

    if (fd < 0) {
        ostringstream oss;
        oss << "! Unable to open the input file: " << filename << " for writing";

        throw oss.str();
    }

    writeMode = true;
}